

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureSpecificationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::TexImageCubeArrayDepthCase::createTexture
          (TexImageCubeArrayDepthCase *this)

{
  ContextWrapper *this_00;
  int depth;
  int internalFormat;
  deUint32 err;
  int level;
  int width;
  deUint32 tex;
  ContextWrapper *local_b8;
  ulong local_b0;
  TransferFormat local_a8;
  TextureLevel levelData;
  Vec4 local_78;
  Vec4 local_68;
  PixelBufferAccess local_58;
  
  local_a8 = glu::getTransferFormat((this->super_TextureCubeArraySpecCase).m_texFormat);
  local_b0 = (ulong)local_a8 >> 0x20;
  tex = 0;
  local_58.super_ConstPixelBufferAccess.m_format =
       glu::mapGLTransferFormat(local_a8.format,local_a8.dataType);
  tcu::TextureLevel::TextureLevel(&levelData,(TextureFormat *)&local_58);
  this_00 = &(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x9009,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  err = sglr::ContextWrapper::glGetError(this_00);
  glu::checkError(err,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureSpecificationTests.cpp"
                  ,0x267);
  local_b8 = this_00;
  if (0 < (this->super_TextureCubeArraySpecCase).m_numLevels) {
    level = 0;
    do {
      width = (this->super_TextureCubeArraySpecCase).m_size >> ((byte)level & 0x1f);
      if (width < 2) {
        width = 1;
      }
      local_68.m_data[0] = -1.5;
      local_68.m_data[1] = -2.0;
      local_68.m_data[2] = 1.7;
      local_68.m_data[3] = -1.5;
      local_78.m_data[0] = 2.0;
      local_78.m_data[1] = 1.5;
      local_78.m_data[2] = -1.0;
      local_78.m_data[3] = 2.0;
      tcu::TextureLevel::setSize
                (&levelData,width,width,(this->super_TextureCubeArraySpecCase).m_depth);
      tcu::TextureLevel::getAccess(&local_58,&levelData);
      tcu::fillWithComponentGradients(&local_58,&local_68,&local_78);
      depth = (this->super_TextureCubeArraySpecCase).m_depth;
      internalFormat = *(int *)&(this->super_TextureCubeArraySpecCase).field_0xd4;
      tcu::TextureLevel::getAccess(&local_58,&levelData);
      sglr::ContextWrapper::glTexImage3D
                (local_b8,0x9009,level,internalFormat,width,width,depth,0,local_a8.format,
                 (deUint32)local_b0,local_58.super_ConstPixelBufferAccess.m_data);
      level = level + 1;
    } while (level < (this->super_TextureCubeArraySpecCase).m_numLevels);
  }
  tcu::TextureLevel::~TextureLevel(&levelData);
  return;
}

Assistant:

void createTexture (void)
	{
		glu::TransferFormat	fmt			= glu::getTransferFormat(m_texFormat);
		deUint32			tex			= 0;
		tcu::TextureLevel	levelData	(glu::mapGLTransferFormat(fmt.format, fmt.dataType));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);
		GLU_CHECK();

		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			const int   levelW		= de::max(1, m_size >> ndx);
			const Vec4  gMin		= Vec4(-1.5f, -2.0f, 1.7f, -1.5f);
			const Vec4  gMax		= Vec4(2.0f, 1.5f, -1.0f, 2.0f);

			levelData.setSize(levelW, levelW, m_depth);
			tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

			glTexImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, ndx, m_internalFormat, levelW, levelW, m_depth, 0, fmt.format, fmt.dataType, levelData.getAccess().getDataPtr());
		}
	}